

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O1

shared_ptr<duckdb::TupleDataLayout,_true> __thiscall
duckdb::PartitionedTupleData::GetLayoutPtr(PartitionedTupleData *this)

{
  pointer pLVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<duckdb::TupleDataLayout,_true> sVar2;
  shared_ptr<duckdb::TupleDataLayout,_true> sVar3;
  
  (in_RDI->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->layout_ptr).internal.
                super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pLVar1 = (pointer)(this->layout_ptr).internal.
                    super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  (in_RDI->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar1;
  if (pLVar1 != (pointer)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)&(pLVar1->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(pLVar1->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      sVar2.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = in_RDI;
      return (shared_ptr<duckdb::TupleDataLayout,_true>)
             sVar2.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)&(pLVar1->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(pLVar1->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    UNLOCK();
  }
  sVar3.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<duckdb::TupleDataLayout,_true>)
         sVar3.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<TupleDataLayout> PartitionedTupleData::GetLayoutPtr() const {
	return layout_ptr;
}